

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

SymOpnd * __thiscall
IRBuilderAsmJs::BuildFieldOpnd
          (IRBuilderAsmJs *this,RegSlot reg,PropertyId propertyId,PropertyKind propertyKind,
          IRType type,bool scale)

{
  PropertySym *sym;
  SymOpnd *pSVar1;
  SymOpnd *symOpnd;
  PropertySym *propertySym;
  PropertyId scaledPropertyId;
  bool scale_local;
  IRType type_local;
  PropertyKind propertyKind_local;
  PropertyId propertyId_local;
  RegSlot reg_local;
  IRBuilderAsmJs *this_local;
  
  propertySym._0_4_ = propertyId;
  if (scale) {
    propertySym._0_4_ = TySize[type] * propertyId;
  }
  sym = BuildFieldSym(this,reg,(PropertyId)propertySym,propertyKind);
  pSVar1 = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
  return pSVar1;
}

Assistant:

IR::SymOpnd *
IRBuilderAsmJs::BuildFieldOpnd(Js::RegSlot reg, Js::PropertyId propertyId, PropertyKind propertyKind, IRType type, bool scale)
{
    Js::PropertyId scaledPropertyId = propertyId;
    if (scale)
    {
        scaledPropertyId *= TySize[type];
    }
    PropertySym * propertySym = BuildFieldSym(reg, scaledPropertyId, propertyKind);
    IR::SymOpnd * symOpnd = IR::SymOpnd::New(propertySym, type, m_func);

    return symOpnd;
}